

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ManInvertConstraints(Aig_Man_t *pAig)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pObj_00;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ManConstrNum(pAig);
  if (iVar1 != 0) {
    for (local_1c = 0; iVar1 = Saig_ManPoNum(pAig), local_1c < iVar1; local_1c = local_1c + 1) {
      pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_1c);
      iVar1 = Saig_ManPoNum(pAig);
      iVar2 = Aig_ManConstrNum(pAig);
      if (iVar1 - iVar2 <= local_1c) {
        Aig_ObjChild0Flip(pObj_00);
      }
    }
  }
  return;
}

Assistant:

void Aig_ManInvertConstraints( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj;
    int i;
    if ( Aig_ManConstrNum(pAig) == 0 )
        return;
    Saig_ManForEachPo( pAig, pObj, i )
    {
        if ( i >= Saig_ManPoNum(pAig) - Aig_ManConstrNum(pAig) )
            Aig_ObjChild0Flip( pObj );
    }
}